

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O3

raw_ostream * __thiscall llvm::raw_ostream::operator<<(raw_ostream *this,format_object_base *Fmt)

{
  uint uVar1;
  size_t in_RCX;
  char *N;
  char *pcVar2;
  bool bVar3;
  SmallVector<char,_128U> V;
  SmallVectorImpl<char> local_b8;
  char local_a8 [128];
  
  pcVar2 = this->OutBufEnd + -(long)this->OutBufCur;
  N = (char *)0x7f;
  if ((char *)0x3 < pcVar2) {
    uVar1 = format_object_base::print(Fmt,this->OutBufCur,(uint)pcVar2);
    N = (char *)(ulong)uVar1;
    if (N <= pcVar2) {
      this->OutBufCur = this->OutBufCur + (long)N;
      return this;
    }
  }
  local_b8.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_b8.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x80;
  local_b8.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_a8;
  do {
    SmallVectorImpl<char>::resize(&local_b8,(size_type)N);
    uVar1 = format_object_base::print
                      (Fmt,(char *)local_b8.super_SmallVectorTemplateBase<char,_true>.
                                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase
                                   .BeginX,(uint)N);
    pcVar2 = (char *)(ulong)uVar1;
    bVar3 = N < pcVar2;
    N = pcVar2;
  } while (bVar3);
  write(this,(int)local_b8.super_SmallVectorTemplateBase<char,_true>.
                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,pcVar2,
        in_RCX);
  if ((char *)local_b8.super_SmallVectorTemplateBase<char,_true>.
              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX != local_a8)
  {
    free(local_b8.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  return this;
}

Assistant:

raw_ostream &raw_ostream::operator<<(const format_object_base &Fmt) {
  // If we have more than a few bytes left in our output buffer, try
  // formatting directly onto its end.
  size_t NextBufferSize = 127;
  size_t BufferBytesLeft = OutBufEnd - OutBufCur;
  if (BufferBytesLeft > 3) {
    size_t BytesUsed = Fmt.print(OutBufCur, BufferBytesLeft);

    // Common case is that we have plenty of space.
    if (BytesUsed <= BufferBytesLeft) {
      OutBufCur += BytesUsed;
      return *this;
    }

    // Otherwise, we overflowed and the return value tells us the size to try
    // again with.
    NextBufferSize = BytesUsed;
  }

  // If we got here, we didn't have enough space in the output buffer for the
  // string.  Try printing into a SmallVector that is resized to have enough
  // space.  Iterate until we win.
  SmallVector<char, 128> V;

  while (true) {
    V.resize(NextBufferSize);

    // Try formatting into the SmallVector.
    size_t BytesUsed = Fmt.print(V.data(), NextBufferSize);

    // If BytesUsed fit into the vector, we win.
    if (BytesUsed <= NextBufferSize)
      return write(V.data(), BytesUsed);

    // Otherwise, try again with a new size.
    assert(BytesUsed > NextBufferSize && "Didn't grow buffer!?");
    NextBufferSize = BytesUsed;
  }
}